

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_file_writer.cpp
# Opt level: O2

void __thiscall
duckdb::BufferedFileWriter::BufferedFileWriter
          (BufferedFileWriter *this,FileSystem *fs,string *path_p,FileOpenFlags open_flags)

{
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var1;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var2;
  _Head_base<0UL,_unsigned_char_*,_false> _Var3;
  FileOpenFlags FVar4;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_40;
  FileOpenFlags local_38;
  
  local_38._8_8_ = open_flags._8_8_;
  local_38.flags = open_flags.flags;
  (this->super_WriteStream)._vptr_WriteStream = (_func_int **)&PTR_WriteData_0278e578;
  this->fs = fs;
  ::std::__cxx11::string::string((string *)&this->path,(string *)path_p);
  _Var3._M_head_impl = (uchar *)operator_new__(0x1000);
  (this->data).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var3._M_head_impl;
  this->offset = 0;
  this->total_written = 0;
  (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  FVar4 = FileOpenFlags::operator|(&local_38,(FileOpenFlags)(ZEXT816(0x102) << 0x40));
  (*fs->_vptr_FileSystem[2])(&local_40,fs,&this->path,FVar4.flags,(ulong)FVar4._8_2_,0);
  _Var2._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (FileHandle *)0x0;
  _Var1._M_head_impl =
       (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (FileHandle *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_FileHandle + 8))();
    if (local_40._M_head_impl != (FileHandle *)0x0) {
      (*(local_40._M_head_impl)->_vptr_FileHandle[1])();
    }
  }
  return;
}

Assistant:

BufferedFileWriter::BufferedFileWriter(FileSystem &fs, const string &path_p, FileOpenFlags open_flags)
    : fs(fs), path(path_p), data(make_unsafe_uniq_array_uninitialized<data_t>(FILE_BUFFER_SIZE)), offset(0),
      total_written(0) {
	handle = fs.OpenFile(path, open_flags | FileLockType::WRITE_LOCK);
}